

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identifier.c
# Opt level: O0

mpt_identifier * mpt_identifier_new(size_t len)

{
  int *piVar1;
  ulong uVar2;
  ulong local_28;
  size_t size;
  mpt_identifier *id;
  size_t len_local;
  
  local_28 = 0x20;
  if (len < 0x10000) {
    uVar2 = len + 4;
    if ((0x20 < uVar2) && (uVar2 < 0x101)) {
      for (; local_28 < uVar2; local_28 = local_28 << 1) {
      }
    }
    len_local = (size_t)malloc(local_28);
    if ((mpt_identifier *)len_local == (mpt_identifier *)0x0) {
      len_local = 0;
    }
    else {
      mpt_identifier_init((mpt_identifier *)len_local,local_28);
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    len_local = 0;
  }
  return (mpt_identifier *)len_local;
}

Assistant:

MPT_STRUCT(identifier) *mpt_identifier_new(size_t len)
{
	MPT_STRUCT(identifier) *id;
	size_t size = 4 * sizeof(void *);
	
	/* bad length constraint */
	if (len > UINT16_MAX) {
		errno = EINVAL;
		return 0;
	}
	/* non-default identifier size */
	len += MPT_IDENT_HSZE;
	if (len > size && len <= 0x100) {
		while (size < len) {
			size *= 2; /* (16,) 32, 64, 128, 256 */
		}
	}
	if (!(id = malloc(size))) {
		return 0;
	}
	mpt_identifier_init(id, size);
	return id;
}